

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  int *c1;
  long lVar1;
  int *piVar2;
  container_t *c;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  uint16_t key;
  int iVar10;
  bool bVar11;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_52;
  uint8_t local_51;
  uint local_50;
  uint local_4c;
  roaring_array_t *local_48;
  ulong local_40;
  uint local_34;
  
  local_51 = '\0';
  local_4c = (x2->high_low_container).size;
  if (local_4c == 0) {
    return;
  }
  uVar3 = (x1->high_low_container).size;
  uVar7 = (ulong)uVar3;
  if (uVar3 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  uVar6 = *(x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  iVar10 = uVar3 - 1;
  uVar8 = 0;
  lVar1 = 0;
  uVar3 = local_4c;
  local_48 = &x2->high_low_container;
LAB_0010ba06:
  do {
    uVar5 = (uint)uVar8;
    uVar9 = (ulong)(int)lVar1;
    while( true ) {
      i = (int)uVar9;
      if (uVar6 == key) break;
      if (key <= uVar6) {
        local_52 = (x2->high_low_container).typecodes[uVar8 & 0xffff];
        local_50 = uVar5;
        local_40 = uVar7;
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar8 & 0xffff],&local_52,
                       (_Bool)((x2->high_low_container).flags & 1));
        uVar5 = local_50;
        if (((x2->high_low_container).flags & 1) != 0) {
          local_48->containers[(int)local_50] = c;
          local_48->typecodes[(int)local_50] = local_52;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,key,c,local_52);
        uVar5 = uVar5 + 1;
        uVar8 = (ulong)uVar5;
        if (uVar5 != local_4c) {
          key = local_48->keys[uVar8 & 0xffff];
        }
        lVar1 = uVar9 + 1;
        uVar7 = (ulong)((int)local_40 + 1);
        iVar10 = iVar10 + 1;
        x2 = (roaring_bitmap_t *)local_48;
        uVar3 = local_4c;
        if (uVar5 != local_4c) goto LAB_0010ba06;
        goto LAB_0010bc11;
      }
      if (iVar10 == i) goto LAB_0010bc11;
      uVar9 = uVar9 + 1;
      uVar6 = (x1->high_low_container).keys[uVar9 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar9 & 0xffff];
    c1 = (int *)(x1->high_low_container).containers[uVar9 & 0xffff];
    piVar2 = c1;
    bVar4 = type1;
    if (type1 == 4) {
      bVar4 = *(byte *)(c1 + 2);
      piVar2 = *(int **)c1;
    }
    if (bVar4 == 3) {
      if ((*piVar2 == 1) && (**(short **)(piVar2 + 2) == 0)) {
        bVar11 = (*(short **)(piVar2 + 2))[1] == -1;
        goto LAB_0010ba68;
      }
LAB_0010ba73:
      local_52 = (x2->high_low_container).typecodes[uVar8 & 0xffff];
      local_34 = (uint)type1;
      if (type1 == 4) {
        local_50 = uVar5;
        local_40 = uVar7;
        piVar2 = (int *)container_or(c1,'\x04',(x2->high_low_container).containers[uVar8 & 0xffff],
                                     local_52,&local_51);
      }
      else {
        local_50 = uVar5;
        local_40 = uVar7;
        piVar2 = (int *)container_ior(c1,type1,(x2->high_low_container).containers[uVar8 & 0xffff],
                                      local_52,&local_51);
      }
      if (piVar2 != c1) {
        container_free(c1,(uint8_t)local_34);
      }
      (x1->high_low_container).containers[uVar9] = piVar2;
      (x1->high_low_container).typecodes[uVar9] = local_51;
      x2 = (roaring_bitmap_t *)local_48;
      uVar7 = local_40;
      uVar3 = local_4c;
      uVar5 = local_50;
    }
    else {
      bVar11 = *piVar2 == 0x10000;
LAB_0010ba68:
      if (!bVar11) goto LAB_0010ba73;
    }
    lVar1 = uVar9 + 1;
    uVar5 = uVar5 + 1;
    uVar8 = (ulong)uVar5;
    if (uVar5 == uVar3 || iVar10 == i) {
LAB_0010bc11:
      if (i + 1 != (int)uVar7) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,uVar5,uVar3,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    uVar6 = (x1->high_low_container).keys[(uint)lVar1 & 0xffff];
    key = (x2->high_low_container).keys[uVar5 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}